

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  float *pfVar7;
  int iVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined8 uVar17;
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined8 uVar32;
  undefined1 uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  size_type __n;
  int iVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  int q;
  float fVar49;
  float fVar50;
  float fVar51;
  long lStack_1a0;
  int local_180;
  float *local_170;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m;
  Mat bottom_blob_bordered;
  Mat bottom_blob_unbordered;
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined3 uVar20;
  undefined1 uVar21;
  undefined2 uVar22;
  undefined1 uVar23;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined3 uVar35;
  undefined1 uVar36;
  undefined2 uVar37;
  undefined1 uVar38;
  
  iVar3 = bottom_blob->c;
  sVar6 = bottom_blob->elemsize;
  iVar4 = this->kernel_w;
  iVar40 = this->dilation_w;
  iVar5 = this->kernel_h;
  iVar42 = this->dilation_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if (sVar6 != 1) {
    bottom_blob_bordered.data = *(void **)opt;
    uVar9 = opt->openmp_blocktime;
    uVar10 = opt->use_winograd_convolution;
    uVar12 = opt->use_sgemm_convolution;
    uVar14 = opt->use_int8_inference;
    uVar16 = opt->use_vulkan_compute;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    bottom_blob_bordered.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar17._0_1_ = opt->use_shader_pack8;
    uVar17._1_1_ = opt->use_subgroup_basic;
    uVar17._2_1_ = opt->use_subgroup_vote;
    uVar17._3_1_ = opt->use_subgroup_ballot;
    uVar18 = opt->use_subgroup_shuffle;
    uVar19 = opt->use_image_storage;
    uVar21 = opt->use_tensor_storage;
    uVar23 = opt->use_weight_fp16_storage;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar17._4_4_ = CONCAT31(uVar20,uVar18);
    uVar24 = opt->flush_denormals;
    uVar25 = opt->use_local_pool_allocator;
    uVar27 = opt->use_reserved_1;
    uVar29 = opt->use_reserved_2;
    uVar31 = opt->use_reserved_3;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar26 = CONCAT31(uVar28,uVar25);
    uVar32._0_1_ = opt->use_reserved_4;
    uVar32._1_1_ = opt->use_reserved_5;
    uVar32._2_1_ = opt->use_reserved_6;
    uVar32._3_1_ = opt->use_reserved_7;
    uVar33 = opt->use_reserved_8;
    uVar34 = opt->use_reserved_9;
    uVar36 = opt->use_reserved_10;
    uVar38 = opt->use_reserved_11;
    uVar37 = CONCAT11(uVar38,uVar36);
    uVar35 = CONCAT21(uVar37,uVar34);
    uVar32._4_4_ = CONCAT31(uVar35,uVar33);
    bottom_blob_bordered.c = (int)uVar32;
    bottom_blob_bordered.dims = (int)uVar17;
    bottom_blob_bordered.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_bordered.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_bordered.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_bordered.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_bordered.elempack = uVar9;
    bottom_blob_bordered._28_4_ = uVar11;
    bottom_blob_bordered.w = uVar17._4_4_;
    bottom_blob_bordered.h = uVar24;
    bottom_blob_bordered.d = uVar26;
    bottom_blob_bordered._60_4_ = uVar32._4_4_;
    quantize_to_int8(bottom_blob,&bottom_blob_unbordered,&this->bottom_blob_int8_scales,
                     (Option *)&bottom_blob_bordered);
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  make_padding(this,&bottom_blob_unbordered,&bottom_blob_bordered,opt);
  iVar41 = bottom_blob_bordered.w;
  local_180 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    iVar8 = (~((iVar4 + -1) * iVar40) + bottom_blob_bordered.w) / this->stride_w;
    iVar5 = (~((iVar5 + -1) * iVar42) + bottom_blob_bordered.h) / this->stride_h;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
    iVar4 = this->dilation_h;
    iVar40 = this->kernel_w;
    iVar42 = this->dilation_w * iVar40;
    iVar43 = 0;
    lVar46 = 0;
    for (iVar45 = 0; iVar45 < this->kernel_h; iVar45 = iVar45 + 1) {
      for (lVar47 = 0; (int)lVar47 < iVar40; lVar47 = lVar47 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar46 + lVar47] = iVar43;
        iVar43 = iVar43 + this->dilation_w;
        iVar40 = this->kernel_w;
      }
      iVar43 = iVar43 + (iVar41 * iVar4 - iVar42);
      lVar46 = (int)lVar46 + lVar47;
    }
    iVar4 = this->int8_scale_term;
    Mat::create(top_blob,iVar8 + 1,iVar5 + 1,this->num_output,(ulong)(iVar4 < 0x65) * 3 + 1,
                opt->blob_allocator);
    local_180 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar48 = 0;
      if (0 < (int)__n) {
        uVar48 = __n & 0xffffffff;
      }
      local_180 = 0;
      iVar40 = iVar3;
      if (iVar3 < 1) {
        iVar40 = 0;
      }
      for (lVar46 = 0; lVar46 < this->num_output; lVar46 = lVar46 + 1) {
        Mat::channel(&m,top_blob,(int)lVar46);
        local_170 = (float *)m.data;
        Mat::~Mat(&m);
        for (iVar42 = 0; iVar42 <= iVar5; iVar42 = iVar42 + 1) {
          for (iVar41 = 0; iVar41 <= iVar8; iVar41 = iVar41 + 1) {
            lVar47 = (long)(this->weight_data).data + (long)((int)__n * iVar3 * (int)lVar46);
            iVar43 = 0;
            for (iVar45 = 0; iVar45 != iVar40; iVar45 = iVar45 + 1) {
              Mat::channel(&m,&bottom_blob_bordered,iVar45);
              for (uVar44 = 0; uVar48 != uVar44; uVar44 = uVar44 + 1) {
                iVar43 = iVar43 + (int)*(char *)(lVar47 + uVar44) *
                                  (int)*(char *)((long)m.data +
                                                (long)_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar44] +
                                                (long)iVar41 * (long)this->stride_w +
                                                (long)m.w * (long)iVar42 * (long)this->stride_h *
                                                m.elemsize);
              }
              lVar47 = lVar47 + __n;
              Mat::~Mat(&m);
            }
            fVar50 = *(float *)((long)(this->weight_data_int8_scales).data + lVar46 * 4);
            fVar49 = 0.0;
            if (fVar50 != 0.0) {
              fVar49 = 1.0 / (fVar50 * *(this->bottom_blob_int8_scales).data);
            }
            fVar49 = (float)iVar43 * fVar49;
            if (this->bias_term != 0) {
              fVar49 = fVar49 + *(float *)((long)(this->bias_data).data + lVar46 * 4);
            }
            fVar50 = fVar49;
            switch(this->activation_type) {
            case 1:
              if (fVar49 <= 0.0) {
                fVar50 = 0.0;
              }
              break;
            case 2:
              fVar50 = (float)(~-(uint)(0.0 < fVar49) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar49) & 0x3f800000) * fVar49;
              break;
            case 3:
              pfVar7 = (float *)(this->activation_params).data;
              fVar50 = *pfVar7;
              if (fVar49 <= fVar50) {
                fVar49 = fVar50;
              }
              fVar1 = pfVar7[1];
              fVar50 = fVar49;
              if (fVar1 <= fVar49) {
                fVar50 = fVar1;
              }
              break;
            case 4:
              fVar50 = expf(-fVar49);
              fVar50 = 1.0 / (fVar50 + 1.0);
              break;
            case 5:
              fVar50 = expf(fVar49);
              fVar50 = logf(fVar50 + 1.0);
              fVar50 = tanhf(fVar50);
              fVar50 = fVar50 * fVar49;
              break;
            case 6:
              pfVar7 = (float *)(this->activation_params).data;
              fVar1 = *pfVar7;
              fVar2 = pfVar7[1];
              fVar51 = -fVar2 / fVar1;
              fVar50 = 0.0;
              if ((fVar51 <= fVar49) && (fVar50 = fVar49, fVar49 <= fVar51 + 1.0 / fVar1)) {
                fVar50 = (fVar1 * fVar49 + fVar2) * fVar49;
              }
            }
            if (iVar4 < 0x65) {
              *local_170 = fVar50;
              lStack_1a0 = 4;
            }
            else {
              fVar50 = roundf(fVar50 * *(this->top_blob_int8_scales).data);
              iVar43 = (int)fVar50;
              if (iVar43 < -0x7e) {
                iVar43 = -0x7f;
              }
              uVar39 = (undefined1)iVar43;
              if (0x7e < iVar43) {
                uVar39 = 0x7f;
              }
              *(undefined1 *)local_170 = uVar39;
              lStack_1a0 = 1;
            }
            local_170 = (float *)((long)local_170 + lStack_1a0);
          }
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_unbordered);
  return local_180;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}